

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O3

void __thiscall D2xNvmFlash::command(D2xNvmFlash *this,uint8_t cmd)

{
  uint32_t uVar1;
  undefined8 *puVar2;
  
  do {
    uVar1 = Samba::readWord((this->super_Flash)._samba,0x41004014);
  } while ((uVar1 & 1) == 0);
  Samba::writeWord((this->super_Flash)._samba,0x41004000,cmd | 0xa500);
  do {
    uVar1 = Samba::readWord((this->super_Flash)._samba,0x41004014);
  } while ((uVar1 & 1) == 0);
  uVar1 = Samba::readWord((this->super_Flash)._samba,0x41004014);
  if ((uVar1 & 2) == 0) {
    return;
  }
  writeReg(this,'\x14',2);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_001187c8;
  __cxa_throw(puVar2,&FlashCmdError::typeinfo,std::exception::~exception);
}

Assistant:

void
D2xNvmFlash::command(uint8_t cmd)
{
    waitReady();

    writeReg(NVM_REG_CTRLA, CMDEX_KEY | cmd);

    waitReady();

    if (readReg(NVM_REG_INTFLAG) & 0x2)
    {
        // Clear the error bit
        writeReg(NVM_REG_INTFLAG, 0x2);
        throw FlashCmdError();
    }
}